

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiContext_conflict *pIVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  char *pcVar4;
  long lVar5;
  ImGuiSettingsHandler *handler;
  int handler_n;
  ImGuiContext_conflict *g;
  size_t *out_size_local;
  
  pIVar1 = GImGui;
  _handler_n = (ImGuiContext *)GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  g = (ImGuiContext_conflict *)out_size;
  ImVector<char>::resize(&(pIVar1->SettingsIniData).Buf,0);
  handler._7_1_ = 0;
  ImVector<char>::push_back(&(_handler_n->SettingsIniData).Buf,(char *)((long)&handler + 7));
  for (handler._0_4_ = 0; (int)handler < (_handler_n->SettingsHandlers).Size;
      handler._0_4_ = (int)handler + 1) {
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[](&_handler_n->SettingsHandlers,(int)handler);
    (*pIVar3->WriteAllFn)(_handler_n,pIVar3,&_handler_n->SettingsIniData);
  }
  if (g != (ImGuiContext_conflict *)0x0) {
    iVar2 = ImGuiTextBuffer::size(&_handler_n->SettingsIniData);
    lVar5 = (long)iVar2;
    g->Initialized = (bool)(char)lVar5;
    g->FontAtlasOwnedByContext = (bool)(char)((ulong)lVar5 >> 8);
    *(int6 *)&g->field_0x2 = (int6)((ulong)lVar5 >> 0x10);
  }
  pcVar4 = ImGuiTextBuffer::c_str(&_handler_n->SettingsIniData);
  return pcVar4;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}